

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree_star_simplex_iterators.h
# Opt level: O0

void __thiscall
Gudhi::
Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>
::increment(Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>
            *this)

{
  type_conflict4 tVar1;
  filter_iterator<Gudhi::Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>::is_coface,_boost::intrusive::list_iterator<boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_true>_>
  *lhs;
  reference pHVar2;
  Node *local_18;
  Node *curr_node;
  Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>
  *this_local;
  
  curr_node = (Node *)this;
  lhs = boost::iterators::detail::
        iterator_facade_base<boost::iterators::filter_iterator<Gudhi::Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>::is_coface,_boost::intrusive::list_iterator<boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_true>_>,_Gudhi::Hooks_simplex_base_link_nodes,_boost::iterators::bidirectional_traversal_tag,_const_Gudhi::Hooks_simplex_base_link_nodes_&,_long,_false,_false>
        ::operator++((iterator_facade_base<boost::iterators::filter_iterator<Gudhi::Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>::is_coface,_boost::intrusive::list_iterator<boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_true>_>,_Gudhi::Hooks_simplex_base_link_nodes,_boost::iterators::bidirectional_traversal_tag,_const_Gudhi::Hooks_simplex_base_link_nodes_&,_long,_false,_false>
                      *)&this->it_);
  tVar1 = boost::iterators::operator==
                    ((iterator_facade<boost::iterators::filter_iterator<Gudhi::Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>::is_coface,_boost::intrusive::list_iterator<boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_true>_>,_Gudhi::Hooks_simplex_base_link_nodes,_boost::iterators::bidirectional_traversal_tag,_const_Gudhi::Hooks_simplex_base_link_nodes_&,_long>
                      *)lhs,(iterator_facade<boost::iterators::filter_iterator<Gudhi::Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>::is_coface,_boost::intrusive::list_iterator<boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_true>_>,_Gudhi::Hooks_simplex_base_link_nodes,_boost::iterators::bidirectional_traversal_tag,_const_Gudhi::Hooks_simplex_base_link_nodes_&,_long>
                             *)&this->end_);
  if (tVar1) {
    this->st_ = (Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)0x0;
  }
  else {
    pHVar2 = boost::iterators::detail::
             iterator_facade_base<boost::iterators::filter_iterator<Gudhi::Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>::is_coface,_boost::intrusive::list_iterator<boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_true>_>,_Gudhi::Hooks_simplex_base_link_nodes,_boost::iterators::bidirectional_traversal_tag,_const_Gudhi::Hooks_simplex_base_link_nodes_&,_long,_false,_false>
             ::operator*((iterator_facade_base<boost::iterators::filter_iterator<Gudhi::Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>::is_coface,_boost::intrusive::list_iterator<boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_true>_>,_Gudhi::Hooks_simplex_base_link_nodes,_boost::iterators::bidirectional_traversal_tag,_const_Gudhi::Hooks_simplex_base_link_nodes_&,_long,_false,_false>
                          *)&this->it_);
    local_18 = (Node *)(pHVar2 + -1);
    Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::simplex_handle_from_node
              ((Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)&stack0xffffffffffffffe0,
               local_18);
    boost::container::dtl::
    iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
    ::operator=(&this->sh_,
                (iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
                 *)&stack0xffffffffffffffe0);
  }
  return;
}

Assistant:

void increment() {
    if (++it_ == end_) {
      st_ = nullptr;
    }       //== end
    else {  // update sh_
      const Node& curr_node = static_cast<const Node&>(*it_);
      sh_ = st_->simplex_handle_from_node(curr_node);
    }
  }